

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift_test.cpp
# Opt level: O1

void read_fvecs(char *filename,float **data,uint32_t *num_vectors,int *dim)

{
  char cVar1;
  uint32_t uVar2;
  ulong uVar3;
  float *pfVar4;
  ifstream in;
  char local_230 [520];
  
  printf("Loading data from %s\n",filename);
  std::ifstream::ifstream(local_230,filename,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::istream::read(local_230,(long)dim);
    std::istream::seekg((long)local_230,_S_beg);
    uVar3 = std::istream::tellg();
    uVar2 = (uint32_t)(uVar3 / ((long)*dim + 1U) >> 2);
    *num_vectors = uVar2;
    pfVar4 = (float *)operator_new__((ulong)(uVar2 * *dim) * 4);
    *data = pfVar4;
    std::istream::seekg((long)local_230,_S_beg);
    if (*num_vectors != 0) {
      uVar3 = 0;
      do {
        std::istream::seekg((long)local_230,4);
        std::istream::read(local_230,(long)(*data + uVar3 * (long)*dim));
        uVar3 = uVar3 + 1;
      } while (uVar3 < *num_vectors);
    }
    std::ifstream::close();
    printf("Data size: (%u, %d)\n",(ulong)*num_vectors,(ulong)(uint)*dim);
    std::ifstream::~ifstream(local_230);
    return;
  }
  printf("Cannot open file: %s\n",filename);
  exit(1);
}

Assistant:

void read_fvecs(char *filename, float *&data, uint32_t &num_vectors, int &dim) {
  printf("Loading data from %s\n", filename);
  std::ifstream in(filename, std::ios::binary);

  if (!in.is_open()) {
    printf("Cannot open file: %s\n", filename);
    exit(1);
    return;
  }

  // Get #dimensions
  in.read((char *)&dim, 4);

  // Get file size
  in.seekg(0, std::ios::end);
  std::ios::pos_type ss = in.tellg();
  size_t fsize = (size_t)ss;

  // fisze = (4 + 4d) * n
  num_vectors = fsize / (1 + dim) / 4;
  data = new float[num_vectors * dim];

  in.seekg(0, std::ios::beg);
  for (size_t i = 0; i < num_vectors; i++) {
    in.seekg(4, std::ios::cur);
    in.read((char *)(data + i * dim), dim * 4);
  }
  in.close();

  printf("Data size: (%u, %d)\n", num_vectors, dim);
  return;
}